

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::getPoints<(TasGrid::RuleLocal::erule)0,TasGrid::localp_loaded>
          (GridLocalPolynomial *this,double *x)

{
  int *piVar1;
  double *pdVar2;
  double dVar3;
  int local_58;
  int j;
  double *s;
  int *p;
  undefined1 local_30 [4];
  int i;
  Wrapper2D<double> split;
  int num_points;
  double *x_local;
  GridLocalPolynomial *this_local;
  
  split.data._4_4_ = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  Utils::Wrapper2D<double>::Wrapper2D
            ((Wrapper2D<double> *)local_30,(this->super_BaseCanonicalGrid).num_dimensions,x);
  for (p._4_4_ = 0; p._4_4_ < split.data._4_4_; p._4_4_ = p._4_4_ + 1) {
    piVar1 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,p._4_4_);
    pdVar2 = Utils::Wrapper2D<double>::getStrip((Wrapper2D<double> *)local_30,p._4_4_);
    for (local_58 = 0; local_58 < (this->super_BaseCanonicalGrid).num_dimensions;
        local_58 = local_58 + 1) {
      dVar3 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)0>(piVar1[local_58]);
      pdVar2[local_58] = dVar3;
    }
  }
  Utils::Wrapper2D<double>::~Wrapper2D((Wrapper2D<double> *)local_30);
  return;
}

Assistant:

void GridLocalPolynomial::getPoints(double *x) const {
    int num_points = (std::is_same<points_mode, localp_loaded>::value) ? points.getNumIndexes() : needed.getNumIndexes();
    Utils::Wrapper2D<double> split(num_dimensions, x);
    #pragma omp parallel for schedule(static)
    for(int i=0; i<num_points; i++) {
        int const *p = (std::is_same<points_mode, localp_loaded>::value) ? points.getIndex(i) : needed.getIndex(i);
        double *s = split.getStrip(i);
        for(int j=0; j<num_dimensions; j++)
            s[j] = RuleLocal::getNode<eff_rule>(p[j]);
    }
}